

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O0

void RDL_findEdges(char *edges,RDL_cfam *RCF,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  char *visited_00;
  char *visited;
  RDL_sPathInfo *spi_local;
  RDL_graph *gra_local;
  RDL_cfam *RCF_local;
  char *edges_local;
  
  visited_00 = (char *)malloc((ulong)gra->E);
  memset(visited_00,0,(ulong)gra->E);
  RDL_giveEdges(RCF->r,RCF->p,edges,gra,spi,visited_00);
  memset(visited_00,0,(ulong)gra->E);
  RDL_giveEdges(RCF->r,RCF->q,edges,gra,spi,visited_00);
  if (RCF->x == 0xffffffff) {
    uVar1 = RDL_edgeId(gra,RCF->p,RCF->q);
    edges[uVar1] = '\x01';
  }
  else {
    uVar1 = RDL_edgeId(gra,RCF->x,RCF->p);
    edges[uVar1] = '\x01';
    uVar1 = RDL_edgeId(gra,RCF->x,RCF->q);
    edges[uVar1] = '\x01';
  }
  free(visited_00);
  return;
}

Assistant:

void RDL_findEdges(char *edges, RDL_cfam *RCF, RDL_graph *gra, RDL_sPathInfo *spi)
{
  char* visited;
  visited = malloc(gra->E * sizeof(*visited));
  memset(visited, 0, gra->E * sizeof(*visited));
  RDL_giveEdges(RCF->r, RCF->p, edges, gra, spi, visited);
  memset(visited, 0, gra->E * sizeof(*visited));
  RDL_giveEdges(RCF->r, RCF->q, edges, gra, spi, visited);
  /* we need to add the edges */
  if(RCF->x < UINT_MAX) /*even family*/
  {
    edges[RDL_edgeId(gra, RCF->x, RCF->p)] = 1;
    edges[RDL_edgeId(gra, RCF->x, RCF->q)] = 1;
  }
  else
  {
    edges[RDL_edgeId(gra, RCF->p, RCF->q)] = 1;
  }
  free(visited);
}